

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O3

int rd_contents_init(archive_read *a,enctype encoding,int a_sum_alg,int e_sum_alg)

{
  void *pvVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  archive_digest *paVar5;
  undefined4 *puVar6;
  char *pcVar7;
  long lVar8;
  
  pvVar1 = a->format->data;
  *(enctype *)((long)pvVar1 + 0x60) = encoding;
  if (encoding - LZMA < 2) {
    if (*(int *)((long)pvVar1 + 0x168) != 0) {
      lzma_end((long)pvVar1 + 0xe0);
      *(undefined4 *)((long)pvVar1 + 0x168) = 0;
    }
    if (*(int *)((long)pvVar1 + 0x1f8) == 4) {
      iVar2 = lzma_stream_decoder((long)pvVar1 + 0xe0,0xffffffffffffffff,8);
    }
    else {
      iVar2 = lzma_alone_decoder((long)pvVar1 + 0xe0,0xffffffffffffffff);
    }
    if (iVar2 != 0) {
      if (iVar2 == 8) {
        pcVar7 = "Internal error initializing compression library: Invalid or unsupported options";
      }
      else {
        if (iVar2 == 5) {
          pcVar7 = "Internal error initializing compression library: Cannot allocate memory";
          iVar2 = 0xc;
          goto LAB_00135eb8;
        }
        pcVar7 = "Internal error initializing lzma library";
      }
LAB_00135eb0:
      iVar2 = -1;
LAB_00135eb8:
      archive_set_error(&a->archive,iVar2,pcVar7);
      return -0x1e;
    }
    puVar6 = (undefined4 *)((long)pvVar1 + 0x168);
    lVar4 = 0x108;
    lVar8 = 0xf0;
LAB_00135edb:
    *puVar6 = 1;
    *(undefined8 *)((long)pvVar1 + lVar8) = 0;
    *(undefined8 *)((long)pvVar1 + lVar4) = 0;
  }
  else if (encoding != NONE) {
    if (encoding != GZIP) {
      uVar3 = *(int *)((long)pvVar1 + 0x1f8) - 2;
      if (uVar3 < 3) {
        pcVar7 = &DAT_0017b4a0 + *(int *)(&DAT_0017b4a0 + (ulong)uVar3 * 4);
      }
      else {
        pcVar7 = "??";
      }
      archive_set_error(&a->archive,-1,"%s compression not supported on this platform",pcVar7);
      return -0x19;
    }
    if (*(int *)((long)pvVar1 + 0xd8) == 0) {
      iVar2 = inflateInit_((long)pvVar1 + 0x68,"1.2.11",0x70);
    }
    else {
      iVar2 = inflateReset();
    }
    if (iVar2 != 0) {
      pcVar7 = "Couldn\'t initialize zlib stream.";
      goto LAB_00135eb0;
    }
    puVar6 = (undefined4 *)((long)pvVar1 + 0xd8);
    lVar4 = 0x90;
    lVar8 = 0x78;
    goto LAB_00135edb;
  }
  pvVar1 = a->format->data;
  *(int *)((long)pvVar1 + 0x170) = a_sum_alg;
  paVar5 = &__archive_digest;
  if (a_sum_alg == 1) {
    paVar5 = (archive_digest *)&__archive_digest.sha1init;
    lVar4 = 0x10;
  }
  else {
    if (a_sum_alg != 2) goto LAB_00135f2b;
    lVar4 = 8;
  }
  (*paVar5->md5init)((archive_sha1_ctx *)((long)pvVar1 + lVar4 + 0x170));
LAB_00135f2b:
  *(int *)((long)pvVar1 + 0x188) = e_sum_alg;
  paVar5 = &__archive_digest;
  if (e_sum_alg == 1) {
    paVar5 = (archive_digest *)&__archive_digest.sha1init;
    lVar4 = 0x10;
  }
  else {
    if (e_sum_alg != 2) {
      return 0;
    }
    lVar4 = 8;
  }
  (*paVar5->md5init)((archive_sha1_ctx *)((long)pvVar1 + lVar4 + 0x188));
  return 0;
}

Assistant:

static int
rd_contents_init(struct archive_read *a, enum enctype encoding,
    int a_sum_alg, int e_sum_alg)
{
	int r;

	/* Init decompress library. */
	if ((r = decompression_init(a, encoding)) != ARCHIVE_OK)
		return (r);
	/* Init checksum library. */
	checksum_init(a, a_sum_alg, e_sum_alg);
	return (ARCHIVE_OK);
}